

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullaryFunctors.h
# Opt level: O2

void __thiscall
Eigen::internal::
binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
::Data::Data(Data *this,XprType *xpr)

{
  (((evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
     *)((long)&(this->lhsImpl).
               super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               .
               super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
               .m_d.lhsImpl.
               super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
               .
               super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
       + 8))->
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  ).m_functor.m_other = (xpr->m_lhs).m_lhs.m_lhs.m_functor.m_other;
  (((evaluator<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
   ((long)&(this->lhsImpl).
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
           .
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.lhsImpl.
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
           .
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
   + 0x18))->super_evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>).
  super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
  .super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
  data = (((xpr->m_lhs).m_lhs.m_rhs.m_expression)->
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  (this->lhsImpl).
  super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  .
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
  super_unary_evaluator<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
  .super_evaluator_wrapper_base<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
  m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
  data = (((xpr->m_lhs).m_rhs.m_expression)->
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  (this->rhsImpl).super_evaluator<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
  super_unary_evaluator<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
  .super_evaluator_wrapper_base<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.
  m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
  data = (((xpr->m_rhs).m_expression)->
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  return;
}

Assistant:

const Scalar operator() () const { return m_other; }